

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

TypeNames * __thiscall
wasm::DefaultTypeNameGenerator::getNames
          (TypeNames *__return_storage_ptr__,DefaultTypeNameGenerator *this,HeapType type)

{
  char *pcVar1;
  size_t sVar2;
  _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true> _Var3;
  undefined1 uVar4;
  undefined1 reuse;
  __node_base _Var5;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>,_bool>
  pVar6;
  string_view s;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
  local_230;
  stringstream stream;
  undefined8 uStack_220;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_218;
  ios_base local_1b0 [264];
  string_view local_a8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_98;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
  local_58;
  __alloc_node_gen_t __alloc_node_gen;
  __buckets_ptr local_48;
  __node_base local_38;
  
  local_98._M_buckets = &local_98._M_single_bucket;
  local_98._M_rehash_policy._4_4_ = 0;
  local_a8 = (string_view)ZEXT816(0);
  local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98._M_element_count = 0;
  local_98._M_bucket_count = 1;
  local_98._M_rehash_policy._M_max_load_factor = 1.0;
  local_98._M_rehash_policy._M_next_resize._0_4_ = 0;
  local_98._M_rehash_policy._M_next_resize._4_4_ = 0;
  local_98._M_single_bucket = (__node_base_ptr)0x0;
  _stream = 0;
  uStack_220 = 0;
  local_218._M_buckets = (__buckets_ptr)0x0;
  local_218._M_bucket_count = 1;
  local_218._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_218._M_element_count = 0;
  local_218._M_rehash_policy._M_max_load_factor = 1.0;
  local_218._M_rehash_policy._4_8_ = 0;
  reuse = 0;
  local_218._M_rehash_policy._M_next_resize._4_4_ = 0;
  local_218._M_single_bucket = (__node_base_ptr)0x0;
  local_230._M_h = (__hashtable_alloc *)type.id;
  local_58._M_h = (__hashtable_alloc *)&local_218;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_218,&local_98,&local_58);
  local_38._M_nxt = (_Hash_node_base *)this;
  pVar6 = std::
          _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<wasm::HeapType_const,wasm::TypeNames>>
                    ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->nameCache,&local_230);
  _Var3 = pVar6.first.
          super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>._M_cur;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_218);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_98);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_00caed52;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_230);
  _Var5._M_nxt = local_38._M_nxt;
  if (type.id < 0x7d) {
switchD_00caec0a_caseD_0:
    handle_unreachable("unexpected kind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x57e);
  }
  uVar4 = 0xb8;
  switch(*(undefined4 *)(type.id + 0x30)) {
  case 0:
    goto switchD_00caec0a_caseD_0;
  case 1:
    reuse = uVar4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_220,"func.",5);
    break;
  case 2:
    reuse = uVar4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_220,"struct.",7);
    _Var5._M_nxt = _Var5._M_nxt + 2;
    break;
  case 3:
    reuse = uVar4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_220,"array.",6);
    _Var5._M_nxt = _Var5._M_nxt + 3;
    break;
  case 4:
    reuse = uVar4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_220,"cont.",5);
    _Var5._M_nxt = _Var5._M_nxt + 1;
    break;
  default:
    goto switchD_00caec0a_default;
  }
  ((DefaultTypeNameGenerator *)_Var5._M_nxt)->funcCount =
       ((DefaultTypeNameGenerator *)_Var5._M_nxt)->funcCount + 1;
  std::ostream::_M_insert<unsigned_long>((ulong)&uStack_220);
switchD_00caec0a_default:
  std::__cxx11::stringbuf::str();
  s._M_str = (char *)0x0;
  s._M_len = (size_t)local_58._M_h;
  local_a8 = IString::interned((IString *)__alloc_node_gen._M_h,s,(bool)reuse);
  local_98._M_rehash_policy._4_4_ = 0;
  local_98._M_buckets = &local_98._M_single_bucket;
  local_98._M_bucket_count = 1;
  local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98._M_element_count = 0;
  local_98._M_rehash_policy._M_max_load_factor = 1.0;
  local_98._M_rehash_policy._M_next_resize._0_4_ = 0;
  local_98._M_rehash_policy._M_next_resize._4_4_ = 0;
  local_98._M_single_bucket = (__node_base_ptr)0x0;
  *(size_t *)
   ((long)_Var3.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
          _M_cur + 0x10) = local_a8._M_len;
  *(char **)((long)_Var3.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                   ._M_cur + 0x18) = local_a8._M_str;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)_Var3.
                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                             ._M_cur + 0x20),&local_98);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_98);
  if ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)local_58._M_h !=
      (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)&local_48) {
    operator_delete(local_58._M_h,(long)local_48 + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_230);
  std::ios_base::~ios_base(local_1b0);
LAB_00caed52:
  pcVar1 = *(char **)((long)_Var3.
                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                            ._M_cur + 0x18);
  (__return_storage_ptr__->name).super_IString.str._M_len =
       *(size_t *)
        ((long)_Var3.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
               _M_cur + 0x10);
  (__return_storage_ptr__->name).super_IString.str._M_str = pcVar1;
  local_230._M_h = (__hashtable_alloc *)&__return_storage_ptr__->fieldNames;
  (__return_storage_ptr__->fieldNames)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->fieldNames)._M_h._M_bucket_count =
       *(size_type *)
        ((long)_Var3.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
               _M_cur + 0x28);
  (__return_storage_ptr__->fieldNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->fieldNames)._M_h._M_element_count =
       *(size_type *)
        ((long)_Var3.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
               _M_cur + 0x38);
  sVar2 = *(size_t *)
           ((long)_Var3.
                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
                  _M_cur + 0x48);
  *(undefined8 *)&(__return_storage_ptr__->fieldNames)._M_h._M_rehash_policy =
       *(undefined8 *)
        ((long)_Var3.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
               _M_cur + 0x40);
  (__return_storage_ptr__->fieldNames)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (__return_storage_ptr__->fieldNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_230._M_h,
             (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)((long)_Var3.
                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                       ._M_cur + 0x20),&local_230);
  return __return_storage_ptr__;
}

Assistant:

TypeNames DefaultTypeNameGenerator::getNames(HeapType type) {
  auto [it, inserted] = nameCache.insert({type, {}});
  if (inserted) {
    // Generate a new name for this type we have not previously seen.
    std::stringstream stream;
    switch (type.getKind()) {
      case HeapTypeKind::Func:
        stream << "func." << funcCount++;
        break;
      case HeapTypeKind::Struct:
        stream << "struct." << structCount++;
        break;
      case HeapTypeKind::Array:
        stream << "array." << arrayCount++;
        break;
      case HeapTypeKind::Cont:
        stream << "cont." << contCount++;
        break;
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }
    it->second = {stream.str(), {}};
  }
  return it->second;
}